

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

ON_AngleValue *
ON_AngleValue::CreateFromString
          (ON_AngleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string)

{
  ON_AngleValue *pOVar1;
  LengthUnitSystem LVar2;
  StringFormat SVar3;
  AngleUnitSystem AVar4;
  undefined1 uVar5;
  double dVar6;
  wchar_t *string_end;
  ON_AngleValue local_38;
  wchar_t *local_20;
  
  dVar6 = Unset.m_angle;
  if ((string == (wchar_t *)0x0) || (*string == L'\0')) {
    LVar2 = Unset.m_context_length_unit_system;
    SVar3 = Unset.m_string_format;
    AVar4 = Unset.m_angle_unit_system;
    uVar5 = Unset._7_1_;
    __return_storage_ptr__->m_context_locale_id = Unset.m_context_locale_id;
    __return_storage_ptr__->m_context_length_unit_system = LVar2;
    __return_storage_ptr__->m_string_format = SVar3;
    __return_storage_ptr__->m_angle_unit_system = AVar4;
    __return_storage_ptr__->field_0x7 = uVar5;
    __return_storage_ptr__->m_angle = dVar6;
    ON_wString::ON_wString(&__return_storage_ptr__->m_angle_as_string,&Unset.m_angle_as_string);
  }
  else {
    local_20 = (wchar_t *)0x0;
    CreateFromSubString(&local_38,parse_settings,string,-1,&local_20);
    if (string < local_20) {
      pOVar1 = &local_38;
      __return_storage_ptr__->m_context_locale_id = local_38.m_context_locale_id;
      __return_storage_ptr__->m_context_length_unit_system = local_38.m_context_length_unit_system;
      __return_storage_ptr__->m_string_format = local_38.m_string_format;
      __return_storage_ptr__->m_angle_unit_system = local_38.m_angle_unit_system;
      __return_storage_ptr__->field_0x7 = local_38._7_1_;
      __return_storage_ptr__->m_angle = local_38.m_angle;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x376,"","Invalid input parameters.");
      dVar6 = Unset.m_angle;
      LVar2 = Unset.m_context_length_unit_system;
      SVar3 = Unset.m_string_format;
      AVar4 = Unset.m_angle_unit_system;
      uVar5 = Unset._7_1_;
      __return_storage_ptr__->m_context_locale_id = Unset.m_context_locale_id;
      __return_storage_ptr__->m_context_length_unit_system = LVar2;
      __return_storage_ptr__->m_string_format = SVar3;
      __return_storage_ptr__->m_angle_unit_system = AVar4;
      __return_storage_ptr__->field_0x7 = uVar5;
      __return_storage_ptr__->m_angle = dVar6;
      pOVar1 = &Unset;
    }
    ON_wString::ON_wString(&__return_storage_ptr__->m_angle_as_string,&pOVar1->m_angle_as_string);
    ON_wString::~ON_wString(&local_38.m_angle_as_string);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_AngleValue ON_AngleValue::CreateFromString(
  ON_ParseSettings parse_settings,
  const wchar_t* string
)
{
  if ( nullptr == string || 0 == string[0] )
    return ON_AngleValue::Unset;

  const wchar_t* string_end = nullptr;
  const ON_AngleValue angle_value = ON_AngleValue::CreateFromSubString(parse_settings, string, -1, &string_end);
  if (nullptr == string_end || !(string < string_end))
  {
    ON_ERROR("Invalid input parameters.");
    return ON_AngleValue::Unset;
  }

  return angle_value;
}